

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleShadingTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleShadingRenderingCase::init
          (SampleShadingRenderingCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  bool bVar1;
  ContextType ctxType;
  int iVar2;
  RenderTarget *pRVar3;
  NotSupportedError *pNVar4;
  EVP_PKEY_CTX *ctx_00;
  undefined1 local_1a0 [16];
  TestLog local_190 [13];
  ios_base local_128 [264];
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_MultisampleRenderCase).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar1) {
    bVar1 = glu::ContextInfo::isExtensionSupported
                      (((this->super_MultisampleRenderCase).super_TestCase.m_context)->m_contextInfo
                       ,"GL_OES_sample_shading");
    if (!bVar1) {
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1a0._0_8_ = local_190;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a0,
                 "Test requires GL_OES_sample_shading extension or a context version 3.2 or higher."
                 ,"");
      tcu::NotSupportedError::NotSupportedError(pNVar4,(string *)local_1a0);
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  if ((this->super_MultisampleRenderCase).m_renderTarget == TARGET_DEFAULT) {
    pRVar3 = Context::getRenderTarget((this->super_MultisampleRenderCase).super_TestCase.m_context);
    if (pRVar3->m_numSamples < 2) {
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1a0._0_8_ = local_190;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a0,"Multisampled default framebuffer required","");
      tcu::NotSupportedError::NotSupportedError(pNVar4,(string *)local_1a0);
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  local_1a0._0_8_ =
       ((this->super_MultisampleRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
       ->m_log;
  this_00 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "Verifying that a varying is given at least N different values for different samples within a single pixel.\n"
             ,0x6b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "\tRender high-frequency function, map result to black/white. Modify N with glMinSampleShading().\n"
             ,0x60);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"\t=> Resulting image should contain N+1 shades of gray.\n",0x37);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  ctx_00 = (EVP_PKEY_CTX *)&std::__cxx11::ostringstream::VTT;
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_128);
  MultisampleShaderRenderUtil::MultisampleRenderCase::init
            (&this->super_MultisampleRenderCase,ctx_00);
  iVar2 = (this->super_MultisampleRenderCase).m_numTargetSamples + 1;
  (this->super_MultisampleRenderCase).m_numIterations = iVar2;
  return iVar2;
}

Assistant:

void SampleShadingRenderingCase::init (void)
{
	// requirements

	if (!contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !m_context.getContextInfo().isExtensionSupported("GL_OES_sample_shading"))
		throw tcu::NotSupportedError("Test requires GL_OES_sample_shading extension or a context version 3.2 or higher.");
	if (m_renderTarget == TARGET_DEFAULT && m_context.getRenderTarget().getNumSamples() <= 1)
		throw tcu::NotSupportedError("Multisampled default framebuffer required");

	// test purpose and expectations
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Verifying that a varying is given at least N different values for different samples within a single pixel.\n"
		<< "	Render high-frequency function, map result to black/white. Modify N with glMinSampleShading().\n"
		<< "	=> Resulting image should contain N+1 shades of gray.\n"
		<< tcu::TestLog::EndMessage;

	// setup resources

	MultisampleShaderRenderUtil::MultisampleRenderCase::init();

	// set iterations

	m_numIterations = m_numTargetSamples + 1;
}